

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O0

err_t cmdPrintMem(void *buf,size_t count)

{
  char *dest;
  ulong in_RSI;
  char *hex;
  void *in_stack_ffffffffffffffd8;
  ulong local_18;
  err_t local_4;
  
  dest = (char *)blobCreate((size_t)in_stack_ffffffffffffffd8);
  local_18 = in_RSI;
  if (dest == (char *)0x0) {
    local_4 = 0x6e;
  }
  else {
    for (; 0xe < local_18; local_18 = local_18 - 0xe) {
      hexFrom(dest,in_stack_ffffffffffffffd8,0x1065e0);
      printf("%s",dest);
    }
    hexFrom(dest,in_stack_ffffffffffffffd8,0x106625);
    printf("%s",dest);
    blobClose((blob_t)0x106642);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

err_t cmdPrintMem(const void* buf, size_t count)
{
	char* hex;
	// pre
	ASSERT(memIsValid(buf, count));
	// выделить память
	hex = (char*)blobCreate(32);
	if (!hex)
		return ERR_OUTOFMEMORY;
	// печатать
	while (count > 14)
	{
		hexFrom(hex, buf, 14);
		printf("%s", hex);
		buf = (const octet*)buf + 14, count -= 14;
	}
	hexFrom(hex, buf, count);
	printf("%s", hex);
	// завершить
	blobClose(hex);
	return ERR_OK;
}